

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void Convert16To8Row_AVX2(uint16_t *src_y,uint8_t *dst_y,int scale,int width)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  int iVar6;
  undefined1 auVar7 [32];
  
  auVar4 = vpunpcklwd_avx(ZEXT416((uint)scale),ZEXT416((uint)scale));
  auVar7._0_4_ = auVar4._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar7._16_4_ = auVar7._0_4_;
  auVar7._20_4_ = auVar7._0_4_;
  auVar7._24_4_ = auVar7._0_4_;
  auVar7._28_4_ = auVar7._0_4_;
  do {
    auVar2 = *(undefined1 (*) [32])src_y;
    pauVar1 = (undefined1 (*) [32])((long)src_y + 0x20);
    src_y = (uint16_t *)((long)src_y + 0x40);
    auVar2 = vpmulhuw_avx2(auVar2,auVar7);
    auVar5 = vpmulhuw_avx2(*pauVar1,auVar7);
    auVar2 = vpackuswb_avx2(auVar2,auVar5);
    auVar2 = vpermq_avx2(auVar2,0xd8);
    *(undefined1 (*) [32])dst_y = auVar2;
    dst_y = (uint8_t *)((long)dst_y + 0x20);
    iVar6 = width + -0x20;
    bVar3 = 0x1f < width;
    width = iVar6;
  } while (iVar6 != 0 && bVar3);
  return;
}

Assistant:

void Convert16To8Row_AVX2(const uint16_t* src_y,
                          uint8_t* dst_y,
                          int scale,
                          int width) {
  // clang-format off
  asm volatile (
      "vmovd       %3,%%xmm2                     \n"
      "vpunpcklwd  %%xmm2,%%xmm2,%%xmm2          \n"
      "vbroadcastss %%xmm2,%%ymm2                \n"

    // 32 pixels per loop.
    LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "add         $0x40,%0                      \n"
      "vpmulhuw    %%ymm2,%%ymm0,%%ymm0          \n"
      "vpmulhuw    %%ymm2,%%ymm1,%%ymm1          \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"  // mutates
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "add         $0x20,%1                      \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
  : "+r"(src_y),   // %0
    "+r"(dst_y),   // %1
    "+r"(width)    // %2
  : "r"(scale)     // %3
  : "memory", "cc", "xmm0", "xmm1", "xmm2");
  // clang-format on
}